

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOperatorTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Performance::anon_unknown_1::OperatorPerformanceCase::init
          (OperatorPerformanceCase *this,EVP_PKEY_CTX *ctx)

{
  ShaderProgram *this_00;
  RenderContext *renderCtx;
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  int extraout_EAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int *piVar5;
  TestLog *pTVar6;
  ShaderProgram *this_01;
  long *plVar7;
  pointer pPVar8;
  TestError *this_02;
  pointer pSVar9;
  size_type *psVar10;
  pointer pPVar11;
  long lVar12;
  long lVar13;
  ProgramSources sources;
  string local_400;
  string local_3e0;
  long local_3c0;
  string local_3b8;
  LogSection local_398;
  long *local_358 [2];
  long local_348 [2];
  undefined1 local_338 [8];
  float fStack_330;
  int iStack_32c;
  pointer local_328;
  float local_320 [24];
  ios_base local_2c0 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_2a8;
  undefined1 local_288 [208];
  undefined1 local_1b8 [8];
  pointer pPStack_1b0;
  pointer local_1a8;
  ios_base local_148 [8];
  ios_base local_140 [272];
  undefined4 extraout_var_02;
  
  this_00 = (ShaderProgram *)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar13 = CONCAT44(extraout_var,iVar3);
  iVar3 = this->m_viewportWidth;
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  if ((0 < iVar3) && (iVar3 <= *(int *)CONCAT44(extraout_var_00,iVar4))) {
    iVar3 = this->m_viewportHeight;
    iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    if ((0 < iVar3) && (iVar3 <= *(int *)(CONCAT44(extraout_var_01,iVar4) + 4))) {
      iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
      piVar5 = (int *)CONCAT44(extraout_var_02,iVar3);
      local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
      local_400.field_2._M_allocated_capacity = 0x61547265646e6552;
      local_400._M_string_length = 0xc;
      local_400.field_2._8_5_ = 0x74656772;
      local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
      local_3e0.field_2._M_allocated_capacity._0_5_ = 0x65646e6552;
      local_3e0.field_2._M_allocated_capacity._5_3_ = 0x742072;
      local_3e0.field_2._8_5_ = 0x7465677261;
      local_3e0._M_string_length = 0xd;
      local_3e0.field_2._M_local_buf[0xd] = '\0';
      tcu::LogSection::LogSection(&local_398,&local_400,&local_3e0);
      tcu::TestLog::startSection
                ((TestLog *)this_00,local_398.m_name._M_dataplus._M_p,
                 local_398.m_description._M_dataplus._M_p);
      local_1b8 = (undefined1  [8])this_00;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pPStack_1b0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pPStack_1b0,"size: ",6);
      std::ostream::operator<<((ostringstream *)&pPStack_1b0,*piVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pPStack_1b0,"x",1);
      std::ostream::operator<<((ostringstream *)&pPStack_1b0,piVar5[1]);
      pTVar6 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      local_338._0_4_ = SUB84(pTVar6,0);
      local_338._4_4_ = (undefined4)((ulong)pTVar6 >> 0x20);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_330);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_330,"bits:",5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_330," R",2);
      std::ostream::operator<<((ostringstream *)&fStack_330,piVar5[2]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_330," G",2);
      std::ostream::operator<<((ostringstream *)&fStack_330,piVar5[3]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_330," B",2);
      std::ostream::operator<<((ostringstream *)&fStack_330,piVar5[4]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_330," A",2);
      std::ostream::operator<<((ostringstream *)&fStack_330,piVar5[5]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_330," D",2);
      std::ostream::operator<<((ostringstream *)&fStack_330,piVar5[6]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_330," S",2);
      std::ostream::operator<<((ostringstream *)&fStack_330,piVar5[7]);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_330);
      std::ios_base::~ios_base(local_2c0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pPStack_1b0);
      std::ios_base::~ios_base(local_140);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398.m_description._M_dataplus._M_p != &local_398.m_description.field_2) {
        operator_delete(local_398.m_description._M_dataplus._M_p,
                        local_398.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398.m_name._M_dataplus._M_p != &local_398.m_name.field_2) {
        operator_delete(local_398.m_name._M_dataplus._M_p,
                        local_398.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
        operator_delete(local_3e0._M_dataplus._M_p,
                        CONCAT35(local_3e0.field_2._M_allocated_capacity._5_3_,
                                 local_3e0.field_2._M_allocated_capacity._0_5_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_400._M_dataplus._M_p != &local_400.field_2) {
        operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
      }
      local_338._0_4_ = SUB84(this_00,0);
      uVar1 = local_338._0_4_;
      local_338._4_4_ = (undefined4)((ulong)this_00 >> 0x20);
      uVar2 = local_338._4_4_;
      if (piVar5[8] == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_330);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_330,"No MSAA",7);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_330);
        std::ostream::operator<<((ostringstream *)&fStack_330,piVar5[8]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_330,"x MSAA",6);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_330);
      std::ios_base::~ios_base(local_2c0);
      tcu::TestLog::endSection((TestLog *)this_00);
      local_338._0_4_ = uVar1;
      local_338._4_4_ = uVar2;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_330);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&fStack_330,"Using additive blending.",0x18);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_330);
      std::ios_base::~ios_base(local_2c0);
      (**(code **)(lVar13 + 0x5e0))(0xbe2);
      (**(code **)(lVar13 + 0x100))(0x8006);
      (**(code **)(lVar13 + 0x120))(1,1);
      (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])
                ((vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
                  *)local_1b8,this);
      local_328 = (this->m_programData).
                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (this->m_programData).
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_1a8;
      pPVar8 = (this->m_programData).
               super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pPVar11 = (this->m_programData).
                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      (this->m_programData).
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1b8;
      (this->m_programData).
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
      ._M_impl.super__Vector_impl_data._M_finish = pPStack_1b0;
      local_338._0_4_ = SUB84(pPVar8,0);
      local_338._4_4_ = (undefined4)((ulong)pPVar8 >> 0x20);
      fStack_330 = SUB84(pPVar11,0);
      iStack_32c = (int)((ulong)pPVar11 >> 0x20);
      local_1b8 = (undefined1  [8])0x0;
      pPStack_1b0 = (pointer)0x0;
      local_1a8 = (pointer)0x0;
      std::
      vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
      ::~vector((vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
                 *)local_338);
      std::
      vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
      ::~vector((vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
                 *)local_1b8);
      pPVar8 = (this->m_programData).
               super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pPVar11 = (this->m_programData).
                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if ((int)((ulong)((long)pPVar11 - (long)pPVar8) >> 3) * -0x11111111 < 1) {
        pSVar9 = (this->m_programs).
                 super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        lVar13 = 0;
        do {
          this_01 = (ShaderProgram *)operator_new(0xd0);
          renderCtx = this->m_renderCtx;
          memset((ProgramSources *)local_338,0,0xac);
          local_288._0_8_ = (pointer)0x0;
          local_288[8] = 0;
          local_288._9_7_ = 0;
          local_288[0x10] = 0;
          local_288._17_8_ = 0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_338,&pPVar8[lVar13].vertShaderSource);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_320,&pPVar8[lVar13].fragShaderSource);
          glu::ShaderProgram::ShaderProgram(this_01,renderCtx,(ProgramSources *)local_338);
          pPStack_1b0 = (pointer)0x0;
          local_1b8 = (undefined1  [8])this_01;
          pPStack_1b0 = (pointer)operator_new(0x20);
          *(undefined4 *)&(pPStack_1b0->vertShaderSource)._M_string_length = 0;
          *(undefined4 *)((long)&(pPStack_1b0->vertShaderSource)._M_string_length + 4) = 0;
          (pPStack_1b0->vertShaderSource)._M_dataplus._M_p = (pointer)&PTR__SharedPtrState_020e0ea0;
          *(ShaderProgram **)&(pPStack_1b0->vertShaderSource).field_2 = this_01;
          *(undefined4 *)&(pPStack_1b0->vertShaderSource)._M_string_length = 1;
          *(undefined4 *)((long)&(pPStack_1b0->vertShaderSource)._M_string_length + 4) = 1;
          std::
          vector<de::SharedPtr<glu::ShaderProgram>,std::allocator<de::SharedPtr<glu::ShaderProgram>>>
          ::emplace_back<de::SharedPtr<glu::ShaderProgram>>
                    ((vector<de::SharedPtr<glu::ShaderProgram>,std::allocator<de::SharedPtr<glu::ShaderProgram>>>
                      *)&this->m_programs,(SharedPtr<glu::ShaderProgram> *)local_1b8);
          if (pPStack_1b0 != (pointer)0x0) {
            LOCK();
            psVar10 = &(pPStack_1b0->vertShaderSource)._M_string_length;
            *(int *)psVar10 = (int)*psVar10 + -1;
            UNLOCK();
            if ((int)*psVar10 == 0) {
              local_1b8 = (undefined1  [8])0x0;
              (**(code **)((pPStack_1b0->vertShaderSource)._M_dataplus._M_p + 0x10))();
            }
            LOCK();
            piVar5 = (int *)((long)&(pPStack_1b0->vertShaderSource)._M_string_length + 4);
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              if (pPStack_1b0 != (pointer)0x0) {
                (**(code **)((pPStack_1b0->vertShaderSource)._M_dataplus._M_p + 8))();
              }
              pPStack_1b0 = (pointer)0x0;
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_288);
          std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::
          ~vector(&local_2a8);
          lVar12 = 0x78;
          do {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_338 + lVar12));
            lVar12 = lVar12 + -0x18;
          } while (lVar12 != -0x18);
          pSVar9 = (this->m_programs).
                   super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (((pSVar9[-1].m_ptr)->m_program).m_info.linkOk == false) {
            glu::operator<<((TestLog *)this_00,pSVar9[-1].m_ptr);
            this_02 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_02,"Compile failed",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pShaderOperatorTests.cpp"
                       ,0x329);
            goto LAB_0136414f;
          }
          lVar13 = lVar13 + 1;
          pPVar8 = (this->m_programData).
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pPVar11 = (this->m_programData).
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        } while (lVar13 < (int)((ulong)((long)pPVar11 - (long)pPVar8) >> 3) * -0x11111111);
      }
      if (0 < (int)((ulong)((long)pSVar9 -
                           (long)(this->m_programs).
                                 super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4)) {
        lVar13 = 0x60;
        local_3c0 = 0;
        lVar12 = 0;
        do {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
          std::ostream::operator<<((ostringstream *)local_1b8,(int)lVar12);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
          std::ios_base::~ios_base(local_148);
          plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_3e0,0,(char *)0x0,0x1c5801e);
          local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
          psVar10 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_400.field_2._M_allocated_capacity = *psVar10;
            local_400.field_2._8_8_ = plVar7[3];
          }
          else {
            local_400.field_2._M_allocated_capacity = *psVar10;
            local_400._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_400._M_string_length = plVar7[1];
          *plVar7 = (long)psVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
          std::ostream::operator<<((ostringstream *)local_1b8,(int)lVar12);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
          std::ios_base::~ios_base(local_148);
          plVar7 = (long *)std::__cxx11::string::replace((ulong)local_358,0,(char *)0x0,0x1ae4370);
          psVar10 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_3b8.field_2._M_allocated_capacity = *psVar10;
            local_3b8.field_2._8_8_ = plVar7[3];
            local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
          }
          else {
            local_3b8.field_2._M_allocated_capacity = *psVar10;
            local_3b8._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_3b8._M_string_length = plVar7[1];
          *plVar7 = (long)psVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          tcu::LogSection::LogSection(&local_398,&local_400,&local_3b8);
          tcu::TestLog::startSection
                    ((TestLog *)this_00,local_398.m_name._M_dataplus._M_p,
                     local_398.m_description._M_dataplus._M_p);
          local_338._0_4_ = uVar1;
          local_338._4_4_ = uVar2;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_330);
          pPVar8 = (this->m_programData).
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&fStack_330,*(char **)((long)pPVar8 + lVar13 + -8),
                     *(long *)((long)&(pPVar8->vertShaderSource)._M_dataplus._M_p + lVar13));
          pTVar6 = tcu::MessageBuilder::operator<<
                             ((MessageBuilder *)local_338,
                              (EndMessageToken *)&tcu::TestLog::EndMessage);
          pTVar6 = glu::operator<<(pTVar6,*(ShaderProgram **)
                                           ((long)&((this->m_programs).
                                                                                                        
                                                  super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->m_ptr
                                           + local_3c0));
          tcu::TestLog::endSection(pTVar6);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_330);
          std::ios_base::~ios_base(local_2c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398.m_description._M_dataplus._M_p != &local_398.m_description.field_2) {
            operator_delete(local_398.m_description._M_dataplus._M_p,
                            local_398.m_description.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398.m_name._M_dataplus._M_p != &local_398.m_name.field_2) {
            operator_delete(local_398.m_name._M_dataplus._M_p,
                            local_398.m_name.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
            operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
          }
          if (local_358[0] != local_348) {
            operator_delete(local_358[0],local_348[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_400._M_dataplus._M_p != &local_400.field_2) {
            operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
            operator_delete(local_3e0._M_dataplus._M_p,
                            CONCAT35(local_3e0.field_2._M_allocated_capacity._5_3_,
                                     local_3e0.field_2._M_allocated_capacity._0_5_) + 1);
          }
          lVar12 = lVar12 + 1;
          local_3c0 = local_3c0 + 0x10;
          lVar13 = lVar13 + 0x78;
        } while (lVar12 < (int)((ulong)((long)(this->m_programs).
                                              super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(this->m_programs).
                                             super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 4));
        pPVar8 = (this->m_programData).
                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pPVar11 = (this->m_programData).
                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      std::vector<int,_std::allocator<int>_>::resize
                (&this->m_highWorkloadSizes,
                 ((long)pPVar11 - (long)pPVar8 >> 3) * -0x1111111111111111);
      std::
      vector<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>,_std::allocator<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>_>_>
      ::resize(&this->m_workloadRecordsFindHigh,
               ((long)(this->m_programData).
                      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->m_programData).
                      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x1111111111111111);
      std::
      vector<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>,_std::allocator<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>_>_>
      ::resize(&this->m_workloadRecords,
               ((long)(this->m_programData).
                      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->m_programData).
                      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x1111111111111111);
      local_338._0_4_ = ((this->m_initialCalibrationStorage).m_ptr)->initialNumCalls;
      local_338._4_4_ = 10;
      fStack_330 = 2e+06;
      iStack_32c = 0x10;
      local_328 = (pointer)0x4682355547023555;
      local_320[0] = 1e+06;
      deqp::gls::TheilSenCalibrator::clear(&this->m_calibrator,(CalibratorParameters *)local_338);
      this->m_state = STATE_CALIBRATING;
      prepareProgram(this,0);
      prepareNextRound(this);
      return extraout_EAX;
    }
  }
  this_02 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_02,(char *)0x0,
             "de::inRange(m_viewportWidth, 1, m_renderCtx.getRenderTarget().getWidth()) && de::inRange(m_viewportHeight, 1, m_renderCtx.getRenderTarget().getHeight())"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pShaderOperatorTests.cpp"
             ,0x311);
LAB_0136414f:
  __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void OperatorPerformanceCase::init (void)
{
	TestLog&				log		= m_testCtx.getLog();
	const glw::Functions&	gl		= m_renderCtx.getFunctions();

	// Validate that we have sane grid and viewport setup.
	DE_ASSERT(de::inBounds(m_gridSizeX, 1, 256) && de::inBounds(m_gridSizeY, 1, 256));
	TCU_CHECK(de::inRange(m_viewportWidth,	1, m_renderCtx.getRenderTarget().getWidth()) &&
			  de::inRange(m_viewportHeight,	1, m_renderCtx.getRenderTarget().getHeight()));

	logRenderTargetInfo(log, m_renderCtx.getRenderTarget());

	log << TestLog::Message << "Using additive blending." << TestLog::EndMessage;
	gl.enable(GL_BLEND);
	gl.blendEquation(GL_FUNC_ADD);
	gl.blendFunc(GL_ONE, GL_ONE);

	// Generate programs.
	DE_ASSERT(m_programs.empty());
	m_programData = generateProgramData();
	DE_ASSERT(!m_programData.empty());

	for (int progNdx = 0; progNdx < (int)m_programData.size(); progNdx++)
	{
		const string& vert = m_programData[progNdx].vertShaderSource;
		const string& frag = m_programData[progNdx].fragShaderSource;

		m_programs.push_back(SharedPtr<ShaderProgram>(new ShaderProgram(m_renderCtx, glu::makeVtxFragSources(vert, frag))));

		if (!m_programs.back()->isOk())
		{
			log << *m_programs.back();
			TCU_FAIL("Compile failed");
		}
	}

	// Log all programs.
	for (int progNdx = 0; progNdx < (int)m_programs.size(); progNdx++)
		log << TestLog::Section("Program" + de::toString(progNdx), "Program " + de::toString(progNdx))
				<< TestLog::Message << m_programData[progNdx].description << TestLog::EndMessage
				<< *m_programs[progNdx]
			<< TestLog::EndSection;

	m_highWorkloadSizes.resize(m_programData.size());
	m_workloadRecordsFindHigh.resize(m_programData.size());
	m_workloadRecords.resize(m_programData.size());

	m_calibrator.clear(CalibratorParameters(m_initialCalibrationStorage->initialNumCalls, 10 /* calibrate iteration frames */, 2000.0f /* calibrate iteration shortcut threshold (ms) */, 16 /* max calibrate iterations */,
											1000.0f/30.0f /* frame time (ms) */, 1000.0f/60.0f /* frame time cap (ms) */, 1000.0f /* target measure duration (ms) */));
	m_state = STATE_CALIBRATING;

	prepareProgram(0);
	prepareNextRound();
}